

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void extract_reference_file(char *name)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  char *pcVar4;
  FILE *__stream_00;
  char *pcVar5;
  char *in_RDI;
  wchar_t n;
  wchar_t bytes;
  char *p;
  FILE *out;
  FILE *in;
  char buff [1024];
  undefined4 in_stack_fffffffffffffbd8;
  uint uVar6;
  undefined4 in_stack_fffffffffffffbdc;
  char *in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbe8;
  char local_408 [168];
  
  sprintf(local_408,"%s/%s.uu",refdir,in_RDI);
  __stream = fopen(local_408,"r");
  failure("Couldn\'t open reference file %s",local_408);
  assertion_assert((char *)__stream,(wchar_t)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                   (void *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  if (__stream != (FILE *)0x0) {
    do {
      pcVar4 = fgets(local_408,0x400,__stream);
      if (pcVar4 == (char *)0x0) {
        return;
      }
      iVar2 = memcmp(local_408,"begin ",6);
    } while (iVar2 != 0);
    __stream_00 = fopen(in_RDI,"wb");
    while (pcVar4 = fgets(local_408,0x400,__stream), pcVar4 != (char *)0x0) {
      pcVar4 = local_408;
      iVar2 = memcmp(local_408,"end",3);
      if (iVar2 == 0) break;
      uVar3 = (int)*pcVar4 - 0x20U & 0x3f;
      pcVar4 = pcVar4 + 1;
      while (0 < (int)uVar3) {
        uVar6 = 0;
        if (0 < (int)uVar3) {
          pcVar5 = pcVar4 + 1;
          cVar1 = *pcVar4;
          pcVar4 = pcVar4 + 2;
          uVar6 = ((int)*pcVar5 - 0x20U & 0x3f) << 0xc | ((int)cVar1 - 0x20U & 0x3f) << 0x12;
          fputc((int)uVar6 >> 0x10,__stream_00);
          uVar3 = uVar3 - 1;
        }
        pcVar5 = pcVar4;
        if (0 < (int)uVar3) {
          pcVar5 = pcVar4 + 1;
          uVar6 = ((int)*pcVar4 - 0x20U & 0x3f) << 6 | uVar6;
          fputc((int)uVar6 >> 8 & 0xff,__stream_00);
          uVar3 = uVar3 - 1;
        }
        pcVar4 = pcVar5;
        if (0 < (int)uVar3) {
          pcVar4 = pcVar5 + 1;
          fputc((int)*pcVar5 - 0x20U & 0x3f | uVar6 & 0xff,__stream_00);
          uVar3 = uVar3 - 1;
        }
      }
    }
    fclose(__stream_00);
    fclose(__stream);
  }
  return;
}

Assistant:

void
extract_reference_file(const char *name)
{
	char buff[1024];
	FILE *in, *out;

	sprintf(buff, "%s/%s.uu", refdir, name);
	in = fopen(buff, "r");
	failure("Couldn't open reference file %s", buff);
	assert(in != NULL);
	if (in == NULL)
		return;
	/* Read up to and including the 'begin' line. */
	for (;;) {
		if (fgets(buff, sizeof(buff), in) == NULL) {
			/* TODO: This is a failure. */
			return;
		}
		if (memcmp(buff, "begin ", 6) == 0)
			break;
	}
	/* Now, decode the rest and write it. */
	/* Not a lot of error checking here; the input better be right. */
	out = fopen(name, "wb");
	while (fgets(buff, sizeof(buff), in) != NULL) {
		char *p = buff;
		int bytes;

		if (memcmp(buff, "end", 3) == 0)
			break;

		bytes = UUDECODE(*p++);
		while (bytes > 0) {
			int n = 0;
			/* Write out 1-3 bytes from that. */
			if (bytes > 0) {
				n = UUDECODE(*p++) << 18;
				n |= UUDECODE(*p++) << 12;
				fputc(n >> 16, out);
				--bytes;
			}
			if (bytes > 0) {
				n |= UUDECODE(*p++) << 6;
				fputc((n >> 8) & 0xFF, out);
				--bytes;
			}
			if (bytes > 0) {
				n |= UUDECODE(*p++);
				fputc(n & 0xFF, out);
				--bytes;
			}
		}
	}
	fclose(out);
	fclose(in);
}